

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_changeColsIntegralityByRange
                   (void *highs,HighsInt from_col,HighsInt to_col,HighsInt *integrality)

{
  int iVar1;
  HighsStatus HVar2;
  reference pvVar3;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  HighsInt ix;
  HighsInt num_ix;
  vector<HighsVarType,_std::allocator<HighsVarType>_> pass_integrality;
  HighsVarType *in_stack_000000b8;
  HighsInt in_stack_000000c0;
  HighsInt in_stack_000000c4;
  Highs *in_stack_000000c8;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar4;
  undefined4 in_stack_ffffffffffffffbc;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *in_stack_ffffffffffffffc0;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_30;
  long local_18;
  int local_10;
  int local_c;
  
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)0x439790);
  iVar1 = (local_10 - local_c) + 1;
  if (0 < iVar1) {
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize
              (in_stack_ffffffffffffffc0,
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    for (iVar4 = 0; iVar4 < iVar1; iVar4 = iVar4 + 1) {
      in_stack_ffffffffffffffb4 =
           CONCAT13((char)*(undefined4 *)(local_18 + (long)iVar4 * 4),
                    (int3)in_stack_ffffffffffffffb4);
      pvVar3 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                         (&local_30,(long)iVar4);
      *pvVar3 = (value_type)((uint)in_stack_ffffffffffffffb4 >> 0x18);
    }
  }
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::data
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)0x43983c);
  HVar2 = Highs::changeColsIntegrality
                    (in_stack_000000c8,in_stack_000000c4,in_stack_000000c0,in_stack_000000b8);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::~vector
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,HVar2));
  return HVar2;
}

Assistant:

HighsInt Highs_changeColsIntegralityByRange(void* highs,
                                            const HighsInt from_col,
                                            const HighsInt to_col,
                                            const HighsInt* integrality) {
  vector<HighsVarType> pass_integrality;
  HighsInt num_ix = to_col - from_col + 1;
  if (num_ix > 0) {
    pass_integrality.resize(num_ix);
    for (HighsInt ix = 0; ix < num_ix; ix++) {
      pass_integrality[ix] = (HighsVarType)integrality[ix];
    }
  }
  return (HighsInt)((Highs*)highs)
      ->changeColsIntegrality(from_col, to_col, pass_integrality.data());
}